

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# net.cpp
# Opt level: O0

void __thiscall ncnn::Net::Net(Net *this)

{
  Option *in_RDI;
  
  Option::Option(in_RDI);
  std::vector<ncnn::Blob,_std::allocator<ncnn::Blob>_>::vector
            ((vector<ncnn::Blob,_std::allocator<ncnn::Blob>_> *)0x12a0a6);
  std::vector<ncnn::Layer_*,_std::allocator<ncnn::Layer_*>_>::vector
            ((vector<ncnn::Layer_*,_std::allocator<ncnn::Layer_*>_> *)0x12a0b4);
  std::vector<ncnn::layer_registry_entry,_std::allocator<ncnn::layer_registry_entry>_>::vector
            ((vector<ncnn::layer_registry_entry,_std::allocator<ncnn::layer_registry_entry>_> *)
             0x12a0c2);
  return;
}

Assistant:

Net::Net()
{
#if NCNN_VULKAN
    vkdev = 0;
    weight_vkallocator = 0;
    weight_staging_vkallocator = 0;

    cast_float32_to_float16 = 0;
    cast_float16_to_float32 = 0;
    packing_pack1 = 0;
    packing_pack4 = 0;
    packing_pack8 = 0;
#endif // NCNN_VULKAN
}